

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O0

void __thiscall rsg::Token::Token(Token *this,char *identifier)

{
  char *pcVar1;
  bad_alloc *this_00;
  char *identifier_local;
  Token *this_local;
  
  this->m_type = IDENTIFIER;
  pcVar1 = deStrdup(identifier);
  (this->m_arg).identifier = pcVar1;
  if ((this->m_arg).identifier == (char *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return;
}

Assistant:

Token::Token (const char* identifier)
	: m_type(IDENTIFIER)
{
	m_arg.identifier = deStrdup(identifier);
	if (!m_arg.identifier)
		throw std::bad_alloc();
}